

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderDesc.cpp
# Opt level: O3

Expected<void,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall
renderdesc::Loader::loadFramebuffers_abi_cxx11_
          (Expected<void,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,Loader *this)

{
  _Rb_tree_node_base *__rhs;
  pointer *ppFVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  _Base_ptr p_Var3;
  Pipeline *pPVar4;
  iterator iVar5;
  Framebuffer *pFVar6;
  pointer pFVar7;
  size_type sVar8;
  bool bVar9;
  undefined8 uVar10;
  Loader *pLVar11;
  undefined8 uVar12;
  byte bVar13;
  int iVar14;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var15;
  long *plVar16;
  _Rb_tree_node_base *p_Var17;
  undefined8 *puVar18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar19;
  _Alloc_hider _Var20;
  size_type *psVar21;
  vector<yaml::Value,_std::allocator<yaml::Value>_> *pvVar22;
  Mapping *pMVar23;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar24;
  ulong uVar25;
  undefined1 *puVar26;
  Mapping *pMVar27;
  reference_wrapper<const_yaml::Mapping> rVar28;
  uint uVar29;
  long lVar30;
  Value *pVVar31;
  Texture texture;
  Expected<void,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  result;
  Expected<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  height_result;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  Expected<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  width_result;
  ExpectedRef<const_Mapping,_std::string> tex_result;
  Expected<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  pingpong_result;
  Framebuffer fb;
  ExpectedRef<const_Sequence,_std::string> textures_result;
  ExpectedRef<const_Sequence,_std::string> size_result;
  ExpectedRef<const_Mapping,_std::string> yfb_result;
  ExpectedRef<const_Mapping,_std::string> map_fb_result;
  undefined1 local_320 [16];
  undefined1 local_310 [39];
  byte local_2e9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_2e8;
  undefined1 local_2e0 [32];
  byte local_2c0;
  undefined1 local_2b8 [32];
  bool local_298;
  string local_290;
  Loader *local_270;
  undefined1 local_268 [16];
  undefined1 local_258 [24];
  long *local_240 [2];
  long local_230 [2];
  undefined1 local_220 [16];
  undefined1 local_210 [24];
  undefined1 local_1f8 [32];
  bool local_1d8;
  undefined1 local_1d0 [16];
  undefined1 local_1c0 [28];
  Framebuffer local_1a4;
  undefined1 local_190 [32];
  bool local_170;
  undefined1 local_168 [32];
  char local_148;
  anon_struct_48_2_fed59856_for_indexes_ *local_140;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_138;
  undefined4 local_130;
  undefined4 local_12c;
  undefined1 local_128 [32];
  bool local_108;
  Value *local_100;
  undefined1 local_f8 [32];
  char local_d8;
  Value *local_d0;
  _Rb_tree_node_base *local_c8;
  reference_wrapper<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_c0;
  PixelType local_b8;
  _Alloc_hider local_b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a0;
  reference_wrapper<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_90;
  PixelType local_88;
  _Alloc_hider local_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  reference_wrapper<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_60;
  PixelType local_58;
  _Alloc_hider local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  pMVar27 = this->root_;
  local_320._0_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_310;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_320,"framebuffers","");
  yaml::Mapping::getMapping
            ((ExpectedRef<const_Mapping,_std::string> *)
             &((anon_union_32_2_9b3c4038_for_Expected<std::reference_wrapper<const_yaml::Mapping>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_2
                *)local_f8)->value_,pMVar27,(string *)local_320);
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_320._0_8_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_310) {
    operator_delete((void *)local_320._0_8_,(ulong)(local_310._0_8_ + 1));
  }
  if (local_d8 == '\0') {
    local_320._0_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_310
    ;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_320,local_f8._0_8_,(undefined1 *)(local_f8._8_8_ + local_f8._0_8_));
    paVar2 = &(__return_storage_ptr__->field_0).error_.error_.field_2;
    *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
      **)&__return_storage_ptr__->field_0 = paVar2;
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_320._0_8_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_310) {
      paVar2->_M_allocated_capacity = local_310._0_8_;
      *(undefined8 *)((long)&(__return_storage_ptr__->field_0).error_.error_.field_2 + 8) =
           local_310._8_8_;
    }
    else {
      *(undefined8 *)&__return_storage_ptr__->field_0 = local_320._0_8_;
      (__return_storage_ptr__->field_0).error_.error_.field_2._M_allocated_capacity =
           local_310._0_8_;
    }
    (__return_storage_ptr__->field_0).error_.error_._M_string_length = local_320._8_8_;
LAB_0012b37c:
    __return_storage_ptr__->has_value_ = false;
  }
  else {
    p_Var17 = *(_Rb_tree_node_base **)(local_f8._0_8_ + 0x18);
    local_c8 = (_Rb_tree_node_base *)(local_f8._0_8_ + 8);
    local_270 = this;
    if (p_Var17 != local_c8) {
      local_138 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&this->names_
      ;
      local_2e8 = &(__return_storage_ptr__->field_0).error_.error_.field_2;
      local_140 = &this->indexes_;
      do {
        pLVar11 = local_270;
        __rhs = p_Var17 + 1;
        _Var15 = std::
                 __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                           ((local_270->names_).framebuffer.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (local_270->names_).framebuffer.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish,__rhs);
        if (_Var15._M_current !=
            (pLVar11->names_).framebuffer.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          format_abi_cxx11_((string *)local_128,"Framebuffer \'%s\' is not unique",
                            *(undefined8 *)__rhs);
          if ((Mapping *)local_128._0_8_ == (Mapping *)(local_128 + 0x10)) {
            local_310._8_8_ = local_128._24_8_;
            local_128._0_8_ = (Mapping *)local_310;
          }
          else {
            local_320._0_8_ = local_128._0_8_;
          }
          local_310._0_8_ = local_128._16_8_;
          *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            **)&__return_storage_ptr__->field_0 = local_2e8;
          if ((Mapping *)local_128._0_8_ == (Mapping *)local_310) {
            local_2e8->_M_allocated_capacity = local_128._16_8_;
            (&local_2e8->_M_allocated_capacity)[1] = local_310._8_8_;
          }
          else {
            *(undefined8 *)&__return_storage_ptr__->field_0 = local_128._0_8_;
            (__return_storage_ptr__->field_0).error_.error_.field_2._M_allocated_capacity =
                 local_128._16_8_;
          }
          (__return_storage_ptr__->field_0).error_.error_._M_string_length = local_128._8_8_;
          goto LAB_0012b37c;
        }
        yaml::Value::getMapping_abi_cxx11_
                  ((ExpectedRef<const_Mapping,_std::string> *)local_128,(Value *)(p_Var17 + 2));
        uVar10 = local_128._0_8_;
        if (local_108 == false) {
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_220,"Framebuffer ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__rhs)
          ;
          plVar16 = (long *)std::__cxx11::string::append((char *)local_220);
          paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)((long)&(((anon_union_32_2_9b3c4038_for_Expected<std::reference_wrapper<const_std::vector<yaml::Value,_std::allocator<yaml::Value>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_2
                                 *)local_168)->error_).error_ + 0x10);
          pvVar22 = (vector<yaml::Value,_std::allocator<yaml::Value>_> *)(plVar16 + 2);
          if ((vector<yaml::Value,_std::allocator<yaml::Value>_> *)*plVar16 == pvVar22) {
            local_168._16_8_ =
                 (pvVar22->super__Vector_base<yaml::Value,_std::allocator<yaml::Value>_>)._M_impl.
                 super__Vector_impl_data._M_start;
            local_168._24_8_ = plVar16[3];
            local_168._0_8_ = paVar2;
          }
          else {
            local_168._16_8_ =
                 (pvVar22->super__Vector_base<yaml::Value,_std::allocator<yaml::Value>_>)._M_impl.
                 super__Vector_impl_data._M_start;
            local_168._0_8_ = (vector<yaml::Value,_std::allocator<yaml::Value>_> *)*plVar16;
          }
          uVar10 = local_168._16_8_;
          sVar8 = plVar16[1];
          *plVar16 = (long)pvVar22;
          plVar16[1] = 0;
          *(undefined1 *)(plVar16 + 2) = 0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_168._0_8_ == paVar2) {
            local_168._0_8_ = local_310;
            local_310._8_8_ = local_168._24_8_;
          }
          local_320._0_8_ = local_310;
          local_168._8_8_ = 0;
          local_168._16_8_ = local_168._16_8_ & 0xffffffffffffff00;
          *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            **)&__return_storage_ptr__->field_0 = local_2e8;
          if (local_168._0_8_ == local_320._0_8_) {
            local_2e8->_M_allocated_capacity = uVar10;
            (&local_2e8->_M_allocated_capacity)[1] = local_310._8_8_;
          }
          else {
            (__return_storage_ptr__->field_0).error_.error_._M_dataplus._M_p =
                 (pointer)local_168._0_8_;
            (__return_storage_ptr__->field_0).error_.error_.field_2._M_allocated_capacity = uVar10;
          }
          (__return_storage_ptr__->field_0).error_.error_._M_string_length = sVar8;
          local_320._8_8_ = 0;
          local_310._0_8_ = uVar10 & 0xffffffffffffff00;
          __return_storage_ptr__->has_value_ = false;
          local_168._0_8_ = paVar2;
          if ((Mapping *)local_220._0_8_ != (Mapping *)(local_220 + 0x10)) {
            operator_delete((void *)local_220._0_8_,local_210._0_8_ + 1);
          }
          bVar9 = false;
        }
        else {
          if ((long)(local_270->names_).framebuffer.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(local_270->names_).framebuffer.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 5 !=
              ((long)(local_270->pipeline_->framebuffers).
                     super__Vector_base<renderdesc::Framebuffer,_std::allocator<renderdesc::Framebuffer>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(local_270->pipeline_->framebuffers).
                     super__Vector_base<renderdesc::Framebuffer,_std::allocator<renderdesc::Framebuffer>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 2) * -0x3333333333333333) {
            __assert_fail("framebuffer_index == pipeline_.framebuffers.size()",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/w23[P]stameska/src/RenderDesc.cpp"
                          ,0x99,"Expected<void, std::string> renderdesc::Loader::loadFramebuffers()"
                         );
          }
          local_320._0_8_ = local_310;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_320,"size","");
          yaml::Mapping::getSequence
                    ((ExpectedRef<const_Sequence,_std::string> *)
                     &((anon_union_32_2_9b3c4038_for_Expected<std::reference_wrapper<const_std::vector<yaml::Value,_std::allocator<yaml::Value>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_2
                        *)local_168)->value_,(Mapping *)uVar10,(string *)local_320);
          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_320._0_8_
              != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_310) {
            operator_delete((void *)local_320._0_8_,(ulong)(local_310._0_8_ + 1));
          }
          uVar12 = local_168._0_8_;
          if (local_148 == '\0') {
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_1d0,"Cannot read size for framebuffer ",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           __rhs);
            plVar16 = (long *)std::__cxx11::string::append((char *)local_1d0);
            local_268._0_8_ = local_268 + 0x10;
            pMVar27 = (Mapping *)(plVar16 + 2);
            if ((Mapping *)*plVar16 == pMVar27) {
              local_258._0_8_ = *(undefined8 *)&(pMVar27->map_)._M_t._M_impl;
              local_258._8_8_ = plVar16[3];
            }
            else {
              local_258._0_8_ = *(undefined8 *)&(pMVar27->map_)._M_t._M_impl;
              local_268._0_8_ = (Mapping *)*plVar16;
            }
            local_268._8_8_ = plVar16[1];
            *plVar16 = (long)pMVar27;
            plVar16[1] = 0;
            *(undefined1 *)(plVar16 + 2) = 0;
            if (local_148 == '\x01') {
              aAppDebugPrintf("[CRASH] Expected has value");
              aAppTerminate(-1);
            }
            plVar16 = (long *)std::__cxx11::string::_M_append(local_268,local_168._0_8_);
            pMVar27 = (Mapping *)(local_220 + 0x10);
            pMVar23 = (Mapping *)(plVar16 + 2);
            if ((Mapping *)*plVar16 == pMVar23) {
              local_210._0_8_ = *(undefined8 *)&(pMVar23->map_)._M_t._M_impl;
              local_210._8_8_ = plVar16[3];
              local_220._0_8_ = pMVar27;
            }
            else {
              local_210._0_8_ = *(undefined8 *)&(pMVar23->map_)._M_t._M_impl;
              local_220._0_8_ = (Mapping *)*plVar16;
            }
            uVar10 = local_210._0_8_;
            sVar8 = plVar16[1];
            *plVar16 = (long)pMVar23;
            plVar16[1] = 0;
            *(undefined1 *)(plVar16 + 2) = 0;
            if ((Mapping *)local_220._0_8_ == pMVar27) {
              local_220._0_8_ = local_310;
              local_310._8_8_ = local_210._8_8_;
            }
            local_320._0_8_ = local_310;
            local_220._8_8_ = 0;
            local_210._0_8_ = local_210._0_8_ & 0xffffffffffffff00;
            *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              **)&__return_storage_ptr__->field_0 = local_2e8;
            if (local_220._0_8_ == local_320._0_8_) {
              local_2e8->_M_allocated_capacity = uVar10;
              (&local_2e8->_M_allocated_capacity)[1] = local_310._8_8_;
            }
            else {
              (__return_storage_ptr__->field_0).error_.error_._M_dataplus._M_p =
                   (pointer)local_220._0_8_;
              (__return_storage_ptr__->field_0).error_.error_.field_2._M_allocated_capacity = uVar10
              ;
            }
            (__return_storage_ptr__->field_0).error_.error_._M_string_length = sVar8;
            local_320._8_8_ = 0;
            local_310._0_8_ = uVar10 & 0xffffffffffffff00;
            __return_storage_ptr__->has_value_ = false;
            local_220._0_8_ = pMVar27;
            if ((Mapping *)local_268._0_8_ != (Mapping *)(local_268 + 0x10)) {
              operator_delete((void *)local_268._0_8_,local_258._0_8_ + 1);
            }
            uVar25 = local_1c0._0_8_;
            pMVar27 = (Mapping *)local_1d0._0_8_;
            if ((Mapping *)local_1d0._0_8_ != (Mapping *)(local_1d0 + 0x10)) {
LAB_0012a702:
              operator_delete(pMVar27,uVar25 + 1);
            }
LAB_0012a70a:
            bVar9 = false;
          }
          else {
            if (*(long *)(local_168._0_8_ + 8) - (long)*(Value **)local_168._0_8_ != 0xe0) {
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_268,"Framebuffer ",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             __rhs);
              plVar16 = (long *)std::__cxx11::string::append((char *)local_268);
              pMVar23 = (Mapping *)(local_220 + 0x10);
              pMVar27 = (Mapping *)(plVar16 + 2);
              if ((Mapping *)*plVar16 == pMVar27) {
                local_210._0_8_ = *(undefined8 *)&(pMVar27->map_)._M_t._M_impl;
                local_210._8_8_ = plVar16[3];
                local_220._0_8_ = pMVar23;
              }
              else {
                local_210._0_8_ = *(undefined8 *)&(pMVar27->map_)._M_t._M_impl;
                local_220._0_8_ = (Mapping *)*plVar16;
              }
              uVar10 = local_210._0_8_;
              sVar8 = plVar16[1];
              *plVar16 = (long)pMVar27;
              plVar16[1] = 0;
              *(undefined1 *)(plVar16 + 2) = 0;
              if ((Mapping *)local_220._0_8_ == pMVar23) {
                local_220._0_8_ = local_310;
                local_310._8_8_ = local_210._8_8_;
              }
              local_320._0_8_ = local_310;
              local_220._8_8_ = 0;
              local_210._0_8_ = local_210._0_8_ & 0xffffffffffffff00;
              *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                **)&__return_storage_ptr__->field_0 = local_2e8;
              if (local_220._0_8_ == local_320._0_8_) {
                local_2e8->_M_allocated_capacity = uVar10;
                (&local_2e8->_M_allocated_capacity)[1] = local_310._8_8_;
              }
              else {
                (__return_storage_ptr__->field_0).error_.error_._M_dataplus._M_p =
                     (pointer)local_220._0_8_;
                (__return_storage_ptr__->field_0).error_.error_.field_2._M_allocated_capacity =
                     uVar10;
              }
              (__return_storage_ptr__->field_0).error_.error_._M_string_length = sVar8;
              local_320._8_8_ = 0;
              local_310._0_8_ = uVar10 & 0xffffffffffffff00;
              __return_storage_ptr__->has_value_ = false;
              uVar25 = local_258._0_8_;
              pMVar27 = (Mapping *)local_268._0_8_;
              local_220._0_8_ = pMVar23;
              if ((Mapping *)local_268._0_8_ != (Mapping *)(local_268 + 0x10)) goto LAB_0012a702;
              goto LAB_0012a70a;
            }
            yaml::Value::getInt_abi_cxx11_
                      ((Expected<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)local_220,*(Value **)local_168._0_8_);
            if ((bool)local_210[0x10] == false) {
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_190,"Cannot read width for framebuffer ",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             __rhs);
              plVar16 = (long *)std::__cxx11::string::append((char *)local_190);
              local_1d0._0_8_ = local_1d0 + 0x10;
              pMVar27 = (Mapping *)(plVar16 + 2);
              if ((Mapping *)*plVar16 == pMVar27) {
                local_1c0._0_8_ = *(undefined8 *)&(pMVar27->map_)._M_t._M_impl;
                local_1c0._8_8_ = plVar16[3];
              }
              else {
                local_1c0._0_8_ = *(undefined8 *)&(pMVar27->map_)._M_t._M_impl;
                local_1d0._0_8_ = (Mapping *)*plVar16;
              }
              local_1d0._8_8_ = plVar16[1];
              *plVar16 = (long)pMVar27;
              plVar16[1] = 0;
              *(undefined1 *)(plVar16 + 2) = 0;
              if ((bool)local_210[0x10] == true) {
                aAppDebugPrintf("[CRASH] Expected has value");
                aAppTerminate(-1);
              }
              plVar16 = (long *)std::__cxx11::string::_M_append(local_1d0,local_220._0_8_);
              pMVar27 = (Mapping *)(local_268 + 0x10);
              pMVar23 = (Mapping *)(plVar16 + 2);
              if ((Mapping *)*plVar16 == pMVar23) {
                local_258._0_8_ = *(undefined8 *)&(pMVar23->map_)._M_t._M_impl;
                local_258._8_8_ = plVar16[3];
                local_268._0_8_ = pMVar27;
              }
              else {
                local_258._0_8_ = *(undefined8 *)&(pMVar23->map_)._M_t._M_impl;
                local_268._0_8_ = (Mapping *)*plVar16;
              }
              uVar10 = local_258._0_8_;
              sVar8 = plVar16[1];
              *plVar16 = (long)pMVar23;
              plVar16[1] = 0;
              *(undefined1 *)(plVar16 + 2) = 0;
              if ((Mapping *)local_268._0_8_ == pMVar27) {
                local_268._0_8_ = local_310;
                local_310._8_8_ = local_258._8_8_;
              }
              local_320._0_8_ = local_310;
              local_268._8_8_ = 0;
              local_258._0_8_ = local_258._0_8_ & 0xffffffffffffff00;
              *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                **)&__return_storage_ptr__->field_0 = local_2e8;
              if (local_268._0_8_ == local_320._0_8_) {
                local_2e8->_M_allocated_capacity = uVar10;
                (&local_2e8->_M_allocated_capacity)[1] = local_310._8_8_;
              }
              else {
                (__return_storage_ptr__->field_0).error_.error_._M_dataplus._M_p =
                     (pointer)local_268._0_8_;
                (__return_storage_ptr__->field_0).error_.error_.field_2._M_allocated_capacity =
                     uVar10;
              }
              (__return_storage_ptr__->field_0).error_.error_._M_string_length = sVar8;
              local_320._8_8_ = 0;
              local_310._0_8_ = uVar10 & 0xffffffffffffff00;
              __return_storage_ptr__->has_value_ = false;
              local_268._0_8_ = pMVar27;
              if ((Mapping *)local_1d0._0_8_ != (Mapping *)(local_1d0 + 0x10)) {
                operator_delete((void *)local_1d0._0_8_,local_1c0._0_8_ + 1);
              }
              if ((vector<yaml::Value,_std::allocator<yaml::Value>_> *)local_190._0_8_ !=
                  (vector<yaml::Value,_std::allocator<yaml::Value>_> *)(local_190 + 0x10)) {
                operator_delete((void *)local_190._0_8_,(ulong)(local_190._16_8_ + 1));
              }
              bVar9 = false;
            }
            else {
              local_12c = local_220._0_4_;
              yaml::Value::getInt_abi_cxx11_
                        ((Expected<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)local_268,(Value *)(*(size_type *)uVar12 + 0x70));
              if ((bool)local_258[0x10] == false) {
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_1f8,"Cannot read height for framebuffer ",
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               __rhs);
                puVar18 = (undefined8 *)std::__cxx11::string::append((char *)local_1f8);
                local_190._0_8_ = local_190 + 0x10;
                pvVar22 = (vector<yaml::Value,_std::allocator<yaml::Value>_> *)(puVar18 + 2);
                if ((vector<yaml::Value,_std::allocator<yaml::Value>_> *)*puVar18 == pvVar22) {
                  local_190._16_8_ =
                       (pvVar22->super__Vector_base<yaml::Value,_std::allocator<yaml::Value>_>).
                       _M_impl.super__Vector_impl_data._M_start;
                  local_190._24_4_ = *(undefined4 *)(puVar18 + 3);
                  local_190._28_4_ = *(undefined4 *)((long)puVar18 + 0x1c);
                }
                else {
                  local_190._16_8_ =
                       (pvVar22->super__Vector_base<yaml::Value,_std::allocator<yaml::Value>_>).
                       _M_impl.super__Vector_impl_data._M_start;
                  local_190._0_8_ = (vector<yaml::Value,_std::allocator<yaml::Value>_> *)*puVar18;
                }
                local_190._8_8_ = puVar18[1];
                *puVar18 = pvVar22;
                puVar18[1] = 0;
                *(undefined1 *)(puVar18 + 2) = 0;
                if ((bool)local_258[0x10] == true) {
                  aAppDebugPrintf("[CRASH] Expected has value");
                  aAppTerminate(-1);
                }
                plVar16 = (long *)std::__cxx11::string::_M_append(local_190,local_268._0_8_);
                pMVar27 = (Mapping *)(local_1d0 + 0x10);
                pMVar23 = (Mapping *)(plVar16 + 2);
                if ((Mapping *)*plVar16 == pMVar23) {
                  local_1c0._0_8_ = *(undefined8 *)&(pMVar23->map_)._M_t._M_impl;
                  local_1c0._8_8_ = plVar16[3];
                  local_1d0._0_8_ = pMVar27;
                }
                else {
                  local_1c0._0_8_ = *(undefined8 *)&(pMVar23->map_)._M_t._M_impl;
                  local_1d0._0_8_ = (Mapping *)*plVar16;
                }
                uVar10 = local_1c0._0_8_;
                sVar8 = plVar16[1];
                *plVar16 = (long)pMVar23;
                plVar16[1] = 0;
                *(undefined1 *)(plVar16 + 2) = 0;
                if ((Mapping *)local_1d0._0_8_ == pMVar27) {
                  local_1d0._0_8_ = local_310;
                  local_310._8_8_ = local_1c0._8_8_;
                }
                local_320._0_8_ = local_310;
                local_1d0._8_8_ = 0;
                local_1c0._0_8_ = local_1c0._0_8_ & 0xffffffffffffff00;
                *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  **)&__return_storage_ptr__->field_0 = local_2e8;
                if (local_1d0._0_8_ == local_320._0_8_) {
                  local_2e8->_M_allocated_capacity = uVar10;
                  (&local_2e8->_M_allocated_capacity)[1] = local_310._8_8_;
                }
                else {
                  (__return_storage_ptr__->field_0).error_.error_._M_dataplus._M_p =
                       (pointer)local_1d0._0_8_;
                  (__return_storage_ptr__->field_0).error_.error_.field_2._M_allocated_capacity =
                       uVar10;
                }
                (__return_storage_ptr__->field_0).error_.error_._M_string_length = sVar8;
                local_320._8_8_ = 0;
                local_310._0_8_ = uVar10 & 0xffffffffffffff00;
                __return_storage_ptr__->has_value_ = false;
                local_1d0._0_8_ = pMVar27;
                if ((vector<yaml::Value,_std::allocator<yaml::Value>_> *)local_190._0_8_ !=
                    (vector<yaml::Value,_std::allocator<yaml::Value>_> *)(local_190 + 0x10)) {
                  operator_delete((void *)local_190._0_8_,(ulong)(local_190._16_8_ + 1));
                }
                if ((Mapping *)local_1f8._0_8_ != (Mapping *)(local_1f8 + 0x10)) {
                  operator_delete((void *)local_1f8._0_8_,(ulong)(local_1f8._16_8_ + 1));
                }
                bVar9 = false;
              }
              else {
                local_130 = local_268._0_4_;
                local_320._0_8_ = local_310;
                std::__cxx11::string::_M_construct<char_const*>((string *)local_320,"pingpong","");
                yaml::Mapping::getInt
                          ((Expected<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)local_1d0,(Mapping *)uVar10,(string *)local_320);
                if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    local_320._0_8_ !=
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_310)
                {
                  operator_delete((void *)local_320._0_8_,(ulong)(local_310._0_8_ + 1));
                }
                local_2e9 = (Mapping *)local_1d0._0_8_ != (Mapping *)0x0 & local_1c0[0x10];
                local_320._0_8_ = local_310;
                std::__cxx11::string::_M_construct<char_const*>((string *)local_320,"textures","");
                yaml::Mapping::getSequence
                          ((ExpectedRef<const_Sequence,_std::string> *)local_190,(Mapping *)uVar10,
                           (string *)local_320);
                if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    local_320._0_8_ !=
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_310)
                {
                  operator_delete((void *)local_320._0_8_,(ulong)(local_310._0_8_ + 1));
                }
                if (local_170 == false) {
                  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_2b8,"Cannot read target textures for framebuffer ",
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)__rhs);
                  plVar16 = (long *)std::__cxx11::string::append((char *)local_2b8);
                  local_2e0._0_8_ = local_2e0 + 0x10;
                  pbVar19 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            (plVar16 + 2);
                  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)*plVar16
                      == pbVar19) {
                    local_2e0._16_8_ =
                         *(undefined8 *)&(((KeyValue *)&pbVar19->_M_dataplus)->_M_t)._M_impl;
                    local_2e0._24_8_ = plVar16[3];
                  }
                  else {
                    local_2e0._16_8_ =
                         *(undefined8 *)&(((KeyValue *)&pbVar19->_M_dataplus)->_M_t)._M_impl;
                    local_2e0._0_8_ =
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         *plVar16;
                  }
                  local_2e0._8_8_ = plVar16[1];
                  *plVar16 = (long)pbVar19;
                  plVar16[1] = 0;
                  *(undefined1 *)(plVar16 + 2) = 0;
                  if (local_170 == true) {
                    aAppDebugPrintf("[CRASH] Expected has value");
                    aAppTerminate(-1);
                  }
                  plVar16 = (long *)std::__cxx11::string::_M_append(local_2e0,local_190._0_8_);
                  rVar28._M_data = (Mapping *)(local_1f8 + 0x10);
                  pMVar27 = (Mapping *)(plVar16 + 2);
                  if ((Mapping *)*plVar16 == pMVar27) {
                    local_1f8._16_8_ = *(undefined8 *)&(pMVar27->map_)._M_t._M_impl;
                    local_1f8._24_8_ = plVar16[3];
                    local_1f8._0_8_ = rVar28._M_data;
                  }
                  else {
                    local_1f8._16_8_ = *(undefined8 *)&(pMVar27->map_)._M_t._M_impl;
                    local_1f8._0_8_ = (Mapping *)*plVar16;
                  }
                  uVar10 = local_1f8._16_8_;
                  sVar8 = plVar16[1];
                  *plVar16 = (long)pMVar27;
                  plVar16[1] = 0;
                  *(undefined1 *)(plVar16 + 2) = 0;
                  if ((Mapping *)local_1f8._0_8_ == rVar28._M_data) {
                    local_1f8._0_8_ = local_310;
                    local_310._8_8_ = local_1f8._24_8_;
                  }
                  local_320._0_8_ = local_310;
                  local_1f8._8_8_ = 0;
                  local_1f8._16_8_ = local_1f8._16_8_ & 0xffffffffffffff00;
                  *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    **)&__return_storage_ptr__->field_0 = local_2e8;
                  if (local_1f8._0_8_ == local_320._0_8_) {
                    local_2e8->_M_allocated_capacity = uVar10;
                    (&local_2e8->_M_allocated_capacity)[1] = local_310._8_8_;
                  }
                  else {
                    (__return_storage_ptr__->field_0).error_.error_._M_dataplus._M_p =
                         (pointer)local_1f8._0_8_;
                    (__return_storage_ptr__->field_0).error_.error_.field_2._M_allocated_capacity =
                         uVar10;
                  }
                  (__return_storage_ptr__->field_0).error_.error_._M_string_length = sVar8;
                  local_320._8_8_ = 0;
                  local_310._0_8_ = uVar10 & 0xffffffffffffff00;
                  __return_storage_ptr__->has_value_ = false;
                  local_1f8._0_8_ = rVar28._M_data;
                  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      local_2e0._0_8_ !=
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      (local_2e0 + 0x10)) {
                    operator_delete((void *)local_2e0._0_8_,(ulong)(local_2e0._16_8_ + 1));
                  }
                  puVar26 = (undefined1 *)local_2b8._16_8_;
                  rVar28._M_data = (Mapping *)local_2b8._0_8_;
                  if ((undefined1 *)local_2b8._0_8_ != local_2b8 + 0x10) {
LAB_0012b253:
                    operator_delete(rVar28._M_data,(ulong)(puVar26 + 1));
                  }
LAB_0012b25b:
                  bVar9 = false;
                }
                else {
                  local_1a4.textures_count = 0;
                  pVVar31 = *(Value **)local_190._0_8_;
                  local_d0 = *(pointer *)(local_190._0_8_ + 8);
                  if (pVVar31 != local_d0) {
                    do {
                      yaml::Value::getMapping_abi_cxx11_
                                ((ExpectedRef<const_Mapping,_std::string> *)local_1f8,pVVar31);
                      if (local_1d8 == false) {
                        format_abi_cxx11_((string *)local_2e0,
                                          "%dth texture of framebuffer %s is not a mapping",
                                          (ulong)(uint)local_1a4.textures_count,*(undefined8 *)__rhs
                                         );
LAB_0012adb9:
                        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_2e0._0_8_ ==
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            (local_2e0 + 0x10)) {
                          local_310._8_8_ = local_2e0._24_8_;
                          pbVar19 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_310;
                        }
                        else {
                          local_320._0_8_ = local_2e0._0_8_;
                          pbVar19 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_2e0._0_8_;
                        }
                        local_310._0_8_ = local_2e0._16_8_;
                        *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                          **)&__return_storage_ptr__->field_0 = local_2e8;
                        if (pbVar19 ==
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_310) {
                          local_2e8->_M_allocated_capacity = local_2e0._16_8_;
                          (&local_2e8->_M_allocated_capacity)[1] = local_310._8_8_;
                        }
                        else {
                          (__return_storage_ptr__->field_0).error_.error_._M_dataplus._M_p =
                               (pointer)pbVar19;
                          (__return_storage_ptr__->field_0).error_.error_.field_2.
                          _M_allocated_capacity = local_2e0._16_8_;
                        }
                        (__return_storage_ptr__->field_0).error_.error_._M_string_length =
                             local_2e0._8_8_;
                        __return_storage_ptr__->has_value_ = false;
LAB_0012b22c:
                        if ((local_1d8 != false) ||
                           (puVar26 = (undefined1 *)local_1f8._16_8_,
                           rVar28._M_data = (Mapping *)local_1f8._0_8_,
                           (Mapping *)local_1f8._0_8_ == (Mapping *)(local_1f8 + 0x10)))
                        goto LAB_0012b25b;
                        goto LAB_0012b253;
                      }
                      if (*(size_t *)(local_1f8._0_8_ + 0x28) != 1) {
                        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)local_2b8,"Framebuffer ",
                                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)__rhs);
                        plVar16 = (long *)std::__cxx11::string::append((char *)local_2b8);
                        pbVar19 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)(local_2e0 + 0x10);
                        pbVar24 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)(plVar16 + 2);
                        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            *plVar16 == pbVar24) {
                          local_2e0._16_8_ =
                               *(undefined8 *)&(((KeyValue *)&pbVar24->_M_dataplus)->_M_t)._M_impl;
                          local_2e0._24_8_ = plVar16[3];
                          local_2e0._0_8_ = pbVar19;
                        }
                        else {
                          local_2e0._16_8_ =
                               *(undefined8 *)&(((KeyValue *)&pbVar24->_M_dataplus)->_M_t)._M_impl;
                          local_2e0._0_8_ =
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               *plVar16;
                        }
                        uVar10 = local_2e0._16_8_;
                        sVar8 = plVar16[1];
                        *plVar16 = (long)pbVar24;
                        plVar16[1] = 0;
                        *(undefined1 *)(plVar16 + 2) = 0;
                        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_2e0._0_8_ == pbVar19) {
                          local_2e0._0_8_ = local_310;
                          local_310._8_8_ = local_2e0._24_8_;
                        }
                        local_320._0_8_ = local_310;
                        local_2e0._8_8_ = 0;
                        local_2e0._16_8_ = local_2e0._16_8_ & 0xffffffffffffff00;
                        *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                          **)&__return_storage_ptr__->field_0 = local_2e8;
                        if (local_2e0._0_8_ == local_320._0_8_) {
                          local_2e8->_M_allocated_capacity = uVar10;
                          (&local_2e8->_M_allocated_capacity)[1] = local_310._8_8_;
                        }
                        else {
                          (__return_storage_ptr__->field_0).error_.error_._M_dataplus._M_p =
                               (pointer)local_2e0._0_8_;
                          (__return_storage_ptr__->field_0).error_.error_.field_2.
                          _M_allocated_capacity = uVar10;
                        }
                        (__return_storage_ptr__->field_0).error_.error_._M_string_length = sVar8;
                        local_320._8_8_ = 0;
                        local_310._0_8_ = uVar10 & 0xffffffffffffff00;
                        __return_storage_ptr__->has_value_ = false;
                        puVar26 = (undefined1 *)local_2b8._16_8_;
                        _Var20._M_p = (pointer)local_2b8._0_8_;
                        local_2e0._0_8_ = pbVar19;
                        if ((undefined1 *)local_2b8._0_8_ == local_2b8 + 0x10) goto LAB_0012b22c;
LAB_0012b224:
                        operator_delete(_Var20._M_p,(ulong)(puVar26 + 1));
                        goto LAB_0012b22c;
                      }
                      if (3 < local_1a4.textures_count) {
                        format_abi_cxx11_((string *)local_2e0,
                                          "Too many targets for framebuffer %s, max: %d",
                                          *(undefined8 *)__rhs,4);
                        goto LAB_0012adb9;
                      }
                      p_Var3 = *(_Base_ptr *)(local_1f8._0_8_ + 0x18);
                      yaml::Value::getString_abi_cxx11_
                                ((ExpectedRef<const_std::string,_std::string> *)local_320,
                                 (Value *)(p_Var3 + 2));
                      uVar10 = local_320._0_8_;
                      if ((bool)local_310[0x10] == false) {
                        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)local_2b8,"Cannot read PixelType: ",
                                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)local_320);
LAB_00129b66:
                        if ((undefined1 *)local_2b8._0_8_ == local_2b8 + 0x10) {
                          local_2e0._0_8_ = local_2e0 + 0x10;
                          local_2e0._24_8_ = local_2b8._24_8_;
                        }
                        else {
                          local_2e0._0_8_ = local_2b8._0_8_;
                        }
                        local_2e0._16_8_ = local_2b8._16_8_;
                        local_2e0._8_8_ = local_2b8._8_8_;
                        local_2c0 = 0;
                        bVar13 = 0;
                      }
                      else {
                        iVar14 = std::__cxx11::string::compare((char *)local_320._0_8_);
                        if (iVar14 == 0) {
                          local_2e0._0_8_ = local_2e0._0_8_ & 0xffffffff00000000;
                        }
                        else {
                          iVar14 = std::__cxx11::string::compare((char *)uVar10);
                          if (iVar14 == 0) {
                            local_2e0._0_4_ = 1;
                          }
                          else {
                            iVar14 = std::__cxx11::string::compare((char *)uVar10);
                            if (iVar14 != 0) {
                              format_abi_cxx11_((string *)local_2b8,"Unexpected pixel type %s",
                                                *(undefined8 *)uVar10);
                              goto LAB_00129b66;
                            }
                            local_2e0._0_4_ = 2;
                          }
                        }
                        local_2c0 = 1;
                        bVar13 = 1;
                      }
                      if (((bool)local_310[0x10] == false) &&
                         ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_320._0_8_ !=
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_310)) {
                        operator_delete((void *)local_320._0_8_,(ulong)(local_310._0_8_ + 1));
                        bVar13 = local_2c0;
                      }
                      if ((bVar13 & 1) == 0) {
                        format_abi_cxx11_((string *)local_2b8,
                                          "Framebuffer %s texture %d has invalid pixel type: %s",
                                          *(undefined8 *)__rhs,(ulong)(uint)local_1a4.textures_count
                                          ,local_2e0._0_8_);
                        if ((undefined1 *)local_2b8._0_8_ == local_2b8 + 0x10) {
                          local_310._8_8_ = local_2b8._24_8_;
                          _Var20._M_p = (pointer)local_310;
                        }
                        else {
                          local_320._0_8_ = local_2b8._0_8_;
                          _Var20._M_p = (pointer)local_2b8._0_8_;
                        }
                        *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                          **)&__return_storage_ptr__->field_0 = local_2e8;
                        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            _Var20._M_p ==
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_310) {
                          local_2e8->_M_allocated_capacity = local_2b8._16_8_;
                          (&local_2e8->_M_allocated_capacity)[1] = local_310._8_8_;
                        }
                        else {
                          (__return_storage_ptr__->field_0).error_.error_._M_dataplus._M_p =
                               _Var20._M_p;
                          (__return_storage_ptr__->field_0).error_.error_.field_2.
                          _M_allocated_capacity = local_2b8._16_8_;
                        }
                        (__return_storage_ptr__->field_0).error_.error_._M_string_length =
                             local_2b8._8_8_;
                        __return_storage_ptr__->has_value_ = false;
                        local_310._0_8_ = local_2b8._16_8_;
                        _Var20._M_p = (pointer)local_2e0._0_8_;
                        puVar26 = (undefined1 *)local_2e0._16_8_;
                        bVar13 = local_2c0 & 1;
joined_r0x0012b20e:
                        local_2e0._0_8_ = _Var20._M_p;
                        local_2e0._16_8_ = puVar26;
                        if ((bVar13 != 0) ||
                           ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            _Var20._M_p ==
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            (local_2e0 + 0x10))) goto LAB_0012b22c;
                        goto LAB_0012b224;
                      }
                      lVar30 = (long)(local_270->names_).texture.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(local_270->names_).texture.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 5;
                      local_100 = pVVar31;
                      if (lVar30 != ((long)(local_270->pipeline_->textures).
                                           super__Vector_base<renderdesc::Texture,_std::allocator<renderdesc::Texture>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)(local_270->pipeline_->textures).
                                           super__Vector_base<renderdesc::Texture,_std::allocator<renderdesc::Texture>_>
                                           ._M_impl.super__Vector_impl_data._M_start >> 4) *
                                    -0x5555555555555555) {
                        __assert_fail("tex_index == pipeline_.textures.size()",
                                      "/workspace/llm4binary/github/license_all_cmakelists_1510/w23[P]stameska/src/RenderDesc.cpp"
                                      ,0xca,
                                      "Expected<void, std::string> renderdesc::Loader::loadFramebuffers()"
                                     );
                      }
                      local_320._4_4_ = local_130;
                      local_320._0_4_ = local_12c;
                      local_320._8_4_ = local_2e0._0_4_;
                      local_310._0_8_ = local_310 + 0x10;
                      local_310._8_8_ = 0;
                      local_310[0x10] = false;
                      local_240[0] = local_230;
                      iVar14 = (int)lVar30;
                      if (local_2e9 != 0) {
                        std::__cxx11::string::_M_construct<char*>
                                  ((string *)local_240,*(long *)(p_Var17 + 1),
                                   (long)&(p_Var17[1]._M_parent)->_M_color + *(long *)(p_Var17 + 1))
                        ;
                        std::__cxx11::string::append((char *)local_240);
                        plVar16 = (long *)std::__cxx11::string::_M_append
                                                    ((char *)local_240,*(ulong *)(p_Var3 + 1));
                        local_290._M_dataplus._M_p = (pointer)((long)&local_290 + 0x10);
                        psVar21 = (size_type *)(plVar16 + 2);
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)*plVar16 ==
                            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)psVar21) {
                          local_290.field_2._M_allocated_capacity = *psVar21;
                          local_290.field_2._8_4_ = (undefined4)plVar16[3];
                          local_290.field_2._12_4_ = *(undefined4 *)((long)plVar16 + 0x1c);
                        }
                        else {
                          local_290.field_2._M_allocated_capacity = *psVar21;
                          local_290._M_dataplus._M_p = (pointer)*plVar16;
                        }
                        local_290._M_string_length = plVar16[1];
                        *plVar16 = (long)psVar21;
                        plVar16[1] = 0;
                        *(undefined1 *)(plVar16 + 2) = 0;
                        local_58 = local_320._8_4_;
                        local_60._M_data =
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_320._0_8_;
                        local_50._M_p = (pointer)&local_40;
                        std::__cxx11::string::_M_construct<char*>
                                  ((string *)&local_50,local_310._0_8_,
                                   (undefined1 *)(local_310._8_8_ + local_310._0_8_));
                        registerTexture((Expected<void,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                         *)local_2b8,local_270,iVar14,Ping,&local_290,
                                        (Texture *)&local_60);
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_50._M_p != &local_40) {
                          operator_delete(local_50._M_p,local_40._M_allocated_capacity + 1);
                        }
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_290._M_dataplus._M_p !=
                            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)((long)&local_290 + 0x10U)) {
                          operator_delete(local_290._M_dataplus._M_p,
                                          local_290.field_2._M_allocated_capacity + 1);
                        }
                        if (local_240[0] != local_230) {
                          operator_delete(local_240[0],local_230[0] + 1);
                        }
                        if (local_298 == false) {
                          local_290._M_dataplus._M_p = (pointer)((long)&local_290 + 0x10);
                          std::__cxx11::string::_M_construct<char*>
                                    ((string *)&local_290,local_2b8._0_8_,
                                     (pointer)(local_2b8._8_8_ + local_2b8._0_8_));
                        }
                        else {
                          local_240[0] = local_230;
                          std::__cxx11::string::_M_construct<char*>
                                    ((string *)local_240,*(long *)(p_Var17 + 1),
                                     (long)&(p_Var17[1]._M_parent)->_M_color +
                                     *(long *)(p_Var17 + 1));
                          std::__cxx11::string::append((char *)local_240);
                          plVar16 = (long *)std::__cxx11::string::_M_append
                                                      ((char *)local_240,*(ulong *)(p_Var3 + 1));
                          pVVar31 = local_100;
                          local_290._M_dataplus._M_p = (pointer)((long)&local_290 + 0x10);
                          psVar21 = (size_type *)(plVar16 + 2);
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)*plVar16 ==
                              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)psVar21) {
                            local_290.field_2._M_allocated_capacity = *psVar21;
                            local_290.field_2._8_4_ = (undefined4)plVar16[3];
                            local_290.field_2._12_4_ = *(undefined4 *)((long)plVar16 + 0x1c);
                          }
                          else {
                            local_290.field_2._M_allocated_capacity = *psVar21;
                            local_290._M_dataplus._M_p = (pointer)*plVar16;
                          }
                          local_290._M_string_length = plVar16[1];
                          *plVar16 = (long)psVar21;
                          plVar16[1] = 0;
                          *(undefined1 *)(plVar16 + 2) = 0;
                          local_88 = local_320._8_4_;
                          local_90._M_data =
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_320._0_8_;
                          local_80._M_p = (pointer)&local_70;
                          std::__cxx11::string::_M_construct<char*>
                                    ((string *)&local_80,local_310._0_8_,
                                     (undefined1 *)(local_310._8_8_ + local_310._0_8_));
                          registerTexture((Expected<void,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                           *)local_2b8,local_270,iVar14,Pong,&local_290,
                                          (Texture *)&local_90);
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_80._M_p != &local_70) {
                            operator_delete(local_80._M_p,local_70._M_allocated_capacity + 1);
                          }
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_290._M_dataplus._M_p !=
                              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)((long)&local_290 + 0x10U)) {
                            operator_delete(local_290._M_dataplus._M_p,
                                            local_290.field_2._M_allocated_capacity + 1);
                          }
                          if (local_240[0] != local_230) {
                            operator_delete(local_240[0],local_230[0] + 1);
                          }
                          if (local_298 != false) goto LAB_0012a13f;
                          local_290._M_dataplus._M_p = (pointer)((long)&local_290 + 0x10);
                          std::__cxx11::string::_M_construct<char*>
                                    ((string *)&local_290,local_2b8._0_8_,
                                     (pointer)(local_2b8._8_8_ + local_2b8._0_8_));
                        }
LAB_0012b080:
                        *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                          **)&__return_storage_ptr__->field_0 = local_2e8;
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_290._M_dataplus._M_p ==
                            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)((long)&local_290 + 0x10U)) {
                          local_2e8->_M_allocated_capacity = local_290.field_2._M_allocated_capacity
                          ;
                          (&local_2e8->_M_allocated_capacity)[1] =
                               CONCAT44(local_290.field_2._12_4_,local_290.field_2._8_4_);
                        }
                        else {
                          (__return_storage_ptr__->field_0).error_.error_._M_dataplus._M_p =
                               local_290._M_dataplus._M_p;
                          (__return_storage_ptr__->field_0).error_.error_.field_2.
                          _M_allocated_capacity = local_290.field_2._M_allocated_capacity;
                        }
                        (__return_storage_ptr__->field_0).error_.error_._M_string_length =
                             local_290._M_string_length;
                        __return_storage_ptr__->has_value_ = false;
                        if ((local_298 == false) &&
                           ((undefined1 *)local_2b8._0_8_ != local_2b8 + 0x10)) {
                          operator_delete((void *)local_2b8._0_8_,(ulong)(local_2b8._16_8_ + 1));
                        }
                        _Var20._M_p = (pointer)local_2e0._0_8_;
                        puVar26 = (undefined1 *)local_2e0._16_8_;
                        bVar13 = local_2c0;
                        if ((undefined1 *)local_310._0_8_ != local_310 + 0x10) {
                          operator_delete((void *)local_310._0_8_,
                                          CONCAT71(local_310._17_7_,local_310[0x10]) + 1);
                          _Var20._M_p = (pointer)local_2e0._0_8_;
                          puVar26 = (undefined1 *)local_2e0._16_8_;
                          bVar13 = local_2c0;
                        }
                        goto joined_r0x0012b20e;
                      }
                      std::__cxx11::string::_M_construct<char*>
                                ((string *)local_240,*(long *)(p_Var17 + 1),
                                 (long)&(p_Var17[1]._M_parent)->_M_color + *(long *)(p_Var17 + 1));
                      std::__cxx11::string::append((char *)local_240);
                      plVar16 = (long *)std::__cxx11::string::_M_append
                                                  ((char *)local_240,*(ulong *)(p_Var3 + 1));
                      pVVar31 = local_100;
                      local_290._M_dataplus._M_p = (pointer)((long)&local_290 + 0x10);
                      psVar21 = (size_type *)(plVar16 + 2);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)*plVar16 ==
                          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)psVar21) {
                        local_290.field_2._M_allocated_capacity = *psVar21;
                        local_290.field_2._8_4_ = (undefined4)plVar16[3];
                        local_290.field_2._12_4_ = *(undefined4 *)((long)plVar16 + 0x1c);
                      }
                      else {
                        local_290.field_2._M_allocated_capacity = *psVar21;
                        local_290._M_dataplus._M_p = (pointer)*plVar16;
                      }
                      local_290._M_string_length = plVar16[1];
                      *plVar16 = (long)psVar21;
                      plVar16[1] = 0;
                      *(undefined1 *)(plVar16 + 2) = 0;
                      local_b8 = local_320._8_4_;
                      local_c0._M_data =
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_320._0_8_;
                      local_b0._M_p = (pointer)&local_a0;
                      std::__cxx11::string::_M_construct<char*>
                                ((string *)&local_b0,local_310._0_8_,
                                 (undefined1 *)(local_310._8_8_ + local_310._0_8_));
                      registerTexture((Expected<void,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                       *)local_2b8,local_270,iVar14,Fixed,&local_290,
                                      (Texture *)&local_c0);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_b0._M_p != &local_a0) {
                        operator_delete(local_b0._M_p,local_a0._M_allocated_capacity + 1);
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_290._M_dataplus._M_p !=
                          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)((long)&local_290 + 0x10U)) {
                        operator_delete(local_290._M_dataplus._M_p,
                                        local_290.field_2._M_allocated_capacity + 1);
                      }
                      if (local_240[0] != local_230) {
                        operator_delete(local_240[0],local_230[0] + 1);
                      }
                      if (local_298 == false) {
                        local_290._M_dataplus._M_p = (pointer)((long)&local_290 + 0x10);
                        std::__cxx11::string::_M_construct<char*>
                                  ((string *)&local_290,local_2b8._0_8_,
                                   (pointer)(local_2b8._8_8_ + local_2b8._0_8_));
                        goto LAB_0012b080;
                      }
LAB_0012a13f:
                      local_1a4.textures[local_1a4.textures_count] = iVar14;
                      local_1a4.textures_count = local_1a4.textures_count + 1;
                      if ((undefined1 *)local_310._0_8_ != local_310 + 0x10) {
                        operator_delete((void *)local_310._0_8_,
                                        CONCAT71(local_310._17_7_,local_310[0x10]) + 1);
                      }
                      if ((local_2c0 == 0) &&
                         ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_2e0._0_8_ !=
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          (local_2e0 + 0x10))) {
                        operator_delete((void *)local_2e0._0_8_,(ulong)(local_2e0._16_8_ + 1));
                      }
                      if ((local_1d8 == false) &&
                         ((Mapping *)local_1f8._0_8_ != (Mapping *)(local_1f8 + 0x10))) {
                        operator_delete((void *)local_1f8._0_8_,(ulong)(local_1f8._16_8_ + 1));
                      }
                      pVVar31 = pVVar31 + 1;
                    } while (pVVar31 != local_d0);
                  }
                  pPVar4 = local_270->pipeline_;
                  iVar5._M_current =
                       (pPVar4->framebuffers).
                       super__Vector_base<renderdesc::Framebuffer,_std::allocator<renderdesc::Framebuffer>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
                  pFVar6 = (pPVar4->framebuffers).
                           super__Vector_base<renderdesc::Framebuffer,_std::allocator<renderdesc::Framebuffer>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage;
                  uVar29 = (int)((ulong)((long)iVar5._M_current -
                                        (long)(pPVar4->framebuffers).
                                              super__Vector_base<renderdesc::Framebuffer,_std::allocator<renderdesc::Framebuffer>_>
                                              ._M_impl.super__Vector_impl_data._M_start) >> 2) *
                           -0x33333333;
                  if (local_2e9 == 0) {
                    if (iVar5._M_current == pFVar6) {
                      std::vector<renderdesc::Framebuffer,std::allocator<renderdesc::Framebuffer>>::
                      _M_realloc_insert<renderdesc::Framebuffer_const&>
                                ((vector<renderdesc::Framebuffer,std::allocator<renderdesc::Framebuffer>>
                                  *)&pPVar4->framebuffers,iVar5,&local_1a4);
                    }
                    else {
                      (iVar5._M_current)->textures[3] = local_1a4.textures[3];
                      (iVar5._M_current)->textures_count = local_1a4.textures_count;
                      (iVar5._M_current)->textures[0] = local_1a4.textures[0];
                      *(undefined8 *)((iVar5._M_current)->textures + 1) = local_1a4.textures._4_8_;
                      ppFVar1 = &(pPVar4->framebuffers).
                                 super__Vector_base<renderdesc::Framebuffer,_std::allocator<renderdesc::Framebuffer>_>
                                 ._M_impl.super__Vector_impl_data._M_finish;
                      *ppFVar1 = *ppFVar1 + 1;
                    }
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)local_138,(value_type *)__rhs);
                    local_320._4_4_ = 0;
                    local_320._0_4_ = uVar29;
                    std::
                    vector<renderdesc::Command::Index,_std::allocator<renderdesc::Command::Index>_>
                    ::emplace_back<renderdesc::Command::Index>
                              (&local_140->framebuffer,(Index *)local_320);
                  }
                  else {
                    if (iVar5._M_current == pFVar6) {
                      std::vector<renderdesc::Framebuffer,std::allocator<renderdesc::Framebuffer>>::
                      _M_realloc_insert<renderdesc::Framebuffer_const&>
                                ((vector<renderdesc::Framebuffer,std::allocator<renderdesc::Framebuffer>>
                                  *)&pPVar4->framebuffers,iVar5,&local_1a4);
                    }
                    else {
                      (iVar5._M_current)->textures[3] = local_1a4.textures[3];
                      (iVar5._M_current)->textures_count = local_1a4.textures_count;
                      (iVar5._M_current)->textures[0] = local_1a4.textures[0];
                      *(undefined8 *)((iVar5._M_current)->textures + 1) = local_1a4.textures._4_8_;
                      ppFVar1 = &(pPVar4->framebuffers).
                                 super__Vector_base<renderdesc::Framebuffer,_std::allocator<renderdesc::Framebuffer>_>
                                 ._M_impl.super__Vector_impl_data._M_finish;
                      *ppFVar1 = *ppFVar1 + 1;
                    }
                    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_320,
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)__rhs,"@ping");
                    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                    emplace_back<std::__cxx11::string>
                              (local_138,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_320);
                    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_320._0_8_ !=
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_310) {
                      operator_delete((void *)local_320._0_8_,(ulong)(local_310._0_8_ + 1));
                    }
                    local_320._4_4_ = 1;
                    local_320._0_4_ = uVar29;
                    std::
                    vector<renderdesc::Command::Index,_std::allocator<renderdesc::Command::Index>_>
                    ::emplace_back<renderdesc::Command::Index>
                              (&local_140->framebuffer,(Index *)local_320);
                    if (0 < (long)local_1a4.textures_count) {
                      lVar30 = 0;
                      do {
                        local_1a4.textures[lVar30] = local_1a4.textures[lVar30] + 1;
                        lVar30 = lVar30 + 1;
                      } while (local_1a4.textures_count != lVar30);
                    }
                    pPVar4 = local_270->pipeline_;
                    iVar5._M_current =
                         (pPVar4->framebuffers).
                         super__Vector_base<renderdesc::Framebuffer,_std::allocator<renderdesc::Framebuffer>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
                    pFVar7 = (pPVar4->framebuffers).
                             super__Vector_base<renderdesc::Framebuffer,_std::allocator<renderdesc::Framebuffer>_>
                             ._M_impl.super__Vector_impl_data._M_start;
                    if (iVar5._M_current ==
                        (pPVar4->framebuffers).
                        super__Vector_base<renderdesc::Framebuffer,_std::allocator<renderdesc::Framebuffer>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                      std::vector<renderdesc::Framebuffer,std::allocator<renderdesc::Framebuffer>>::
                      _M_realloc_insert<renderdesc::Framebuffer_const&>
                                ((vector<renderdesc::Framebuffer,std::allocator<renderdesc::Framebuffer>>
                                  *)&pPVar4->framebuffers,iVar5,&local_1a4);
                    }
                    else {
                      (iVar5._M_current)->textures[3] = local_1a4.textures[3];
                      (iVar5._M_current)->textures_count = local_1a4.textures_count;
                      (iVar5._M_current)->textures[0] = local_1a4.textures[0];
                      *(undefined8 *)((iVar5._M_current)->textures + 1) = local_1a4.textures._4_8_;
                      ppFVar1 = &(pPVar4->framebuffers).
                                 super__Vector_base<renderdesc::Framebuffer,_std::allocator<renderdesc::Framebuffer>_>
                                 ._M_impl.super__Vector_impl_data._M_finish;
                      *ppFVar1 = *ppFVar1 + 1;
                    }
                    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_320,
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)__rhs,"@pong");
                    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                    emplace_back<std::__cxx11::string>
                              (local_138,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_320);
                    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_320._0_8_ !=
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_310) {
                      operator_delete((void *)local_320._0_8_,(ulong)(local_310._0_8_ + 1));
                    }
                    local_320._4_4_ = 0;
                    local_320._0_4_ =
                         (int)((ulong)((long)iVar5._M_current - (long)pFVar7) >> 2) * -0x33333333;
                    std::
                    vector<renderdesc::Command::Index,_std::allocator<renderdesc::Command::Index>_>
                    ::emplace_back<renderdesc::Command::Index>
                              (&local_140->framebuffer,(Index *)local_320);
                  }
                  bVar9 = true;
                }
                if ((local_170 == false) &&
                   ((vector<yaml::Value,_std::allocator<yaml::Value>_> *)local_190._0_8_ !=
                    (vector<yaml::Value,_std::allocator<yaml::Value>_> *)(local_190 + 0x10))) {
                  operator_delete((void *)local_190._0_8_,(ulong)(local_190._16_8_ + 1));
                }
                if (((bool)local_1c0[0x10] == false) &&
                   ((Mapping *)local_1d0._0_8_ != (Mapping *)(local_1d0 + 0x10))) {
                  operator_delete((void *)local_1d0._0_8_,local_1c0._0_8_ + 1);
                }
              }
              if (((bool)local_258[0x10] == false) &&
                 ((Mapping *)local_268._0_8_ != (Mapping *)(local_268 + 0x10))) {
                operator_delete((void *)local_268._0_8_,local_258._0_8_ + 1);
              }
            }
            if (((bool)local_210[0x10] == false) &&
               ((Mapping *)local_220._0_8_ != (Mapping *)(local_220 + 0x10))) {
              operator_delete((void *)local_220._0_8_,local_210._0_8_ + 1);
            }
          }
          if ((local_148 == '\0') &&
             ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_168._0_8_ !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)((long)&(((anon_union_32_2_9b3c4038_for_Expected<std::reference_wrapper<const_std::vector<yaml::Value,_std::allocator<yaml::Value>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_2
                            *)local_168)->error_).error_ + 0x10U))) {
            operator_delete((void *)local_168._0_8_,local_168._16_8_ + 1);
          }
        }
        if ((local_108 == false) && ((Mapping *)local_128._0_8_ != (Mapping *)(local_128 + 0x10))) {
          operator_delete((void *)local_128._0_8_,(ulong)(local_128._16_8_ + 1));
        }
        if (!bVar9) goto LAB_0012b380;
        p_Var17 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var17);
      } while (p_Var17 != local_c8);
    }
    __return_storage_ptr__->has_value_ = true;
  }
LAB_0012b380:
  if ((local_d8 == '\0') &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._0_8_ !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)((long)&(((anon_union_32_2_9b3c4038_for_Expected<std::reference_wrapper<const_yaml::Mapping>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_2
                    *)local_f8)->error_).error_ + 0x10U))) {
    operator_delete((void *)local_f8._0_8_,local_f8._16_8_ + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

Expected<void, std::string> loadFramebuffers() {
		auto map_fb_result = root_.getMapping("framebuffers");
		if (!map_fb_result)
			return Unexpected(map_fb_result.error());

		for (const auto &[name, yfbv]: map_fb_result.value().get().map()) {
			if (std::find(names_.framebuffer.begin(), names_.framebuffer.end(), name) != names_.framebuffer.end())
				return Unexpected(format("Framebuffer '%s' is not unique", name.c_str()));

			auto yfb_result = yfbv.getMapping();
			if (!yfb_result)
				return Unexpected("Framebuffer " + name + " desc object is not a mapping");
			const yaml::Mapping &yfb = yfb_result.value();

			const size_t framebuffer_index = names_.framebuffer.size();
			assert(framebuffer_index == pipeline_.framebuffers.size());

			auto size_result = yfb.getSequence("size");
			if (!size_result)
				return Unexpected("Cannot read size for framebuffer " + name + ": " + size_result.error());
			const yaml::Sequence &size = size_result.value();

			if (size.size() != 2)
				return Unexpected("Framebuffer " + name + " size must have 2 elements");

			auto width_result = readVariable(size[0]);
			if (!width_result)
				return Unexpected("Cannot read width for framebuffer " + name + ": " + width_result.error());
			const int width = width_result.value();

			auto height_result = readVariable(size[1]);
			if (!height_result)
				return Unexpected("Cannot read height for framebuffer " + name + ": " + height_result.error());
			const int height = height_result.value();

			const auto pingpong_result = yfb.getInt("pingpong");
			const bool pingpong = pingpong_result && pingpong_result.value();

			auto textures_result = yfb.getSequence("textures");
			if (!textures_result)
				return Unexpected("Cannot read target textures for framebuffer " + name + ": " + textures_result.error());
			const yaml::Sequence &ytextures = textures_result.value();
			Framebuffer fb;
			fb.textures_count = 0;
			for (const auto &ytex: ytextures) {
				auto tex_result = ytex.getMapping();
				if (!tex_result)
					return Unexpected(format("%dth texture of framebuffer %s is not a mapping", fb.textures_count, name.c_str()));
				const yaml::Mapping &tex = tex_result.value();
				if (tex.map().size() != 1)
					return Unexpected("Framebuffer " + name + " target texture should have only one key:value pair: name and format");

				const auto &[tex_name, tex_type_name] = *tex.map().begin();
				if (fb.textures_count >= MAX_TARGET_TEXTURES)
					return Unexpected(format("Too many targets for framebuffer %s, max: %d",
						name.c_str(), MAX_TARGET_TEXTURES));

				auto tex_type_result = pixelTypeFromValue(tex_type_name);
				if (!tex_type_result)
					return Unexpected(format("Framebuffer %s texture %d has invalid pixel type: %s",
						name.c_str(), fb.textures_count, tex_type_result.error().c_str()));
				const PixelType tex_type = tex_type_result.value();

				const size_t tex_index = names_.texture.size();
				assert(tex_index == pipeline_.textures.size());

				Texture texture{width, height, tex_type};
				if (pingpong) {
					{
						auto result = registerTexture(tex_index, Command::Index::Pingpong::Ping, name + "@ping." + tex_name, texture);
						if (!result)
							return Unexpected(result.error());
					}

					{
						auto result = registerTexture(tex_index, Command::Index::Pingpong::Pong, name + "@pong." + tex_name, texture);
						if (!result)
							return Unexpected(result.error());
					}
				} else {
					auto result = registerTexture(tex_index, Command::Index::Pingpong::Fixed, name + "." + tex_name, texture);
					if (!result)
						return Unexpected(result.error());
				}

				fb.textures[fb.textures_count] = (int)tex_index;
				++fb.textures_count;
			}

			if (pingpong) {
				{
					const int index = (int)pipeline_.framebuffers.size();
					pipeline_.framebuffers.push_back(fb);
					names_.framebuffer.push_back(name + "@ping");
					indexes_.framebuffer.emplace_back(Command::Index(index, Command::Index::Pingpong::Ping));
				}

				for (int i = 0; i < fb.textures_count; ++i)
					fb.textures[i] += 1;

				{
					const int index = (int)pipeline_.framebuffers.size();
					pipeline_.framebuffers.push_back(fb);
					names_.framebuffer.push_back(name + "@pong");
					indexes_.framebuffer.emplace_back(Command::Index(index));
				}
			} else {
				const int index = (int)pipeline_.framebuffers.size();
				pipeline_.framebuffers.push_back(fb);
				names_.framebuffer.push_back(name);
				indexes_.framebuffer.emplace_back(Command::Index(index));
			}
		}

		return Expected<void, std::string>();
	}